

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O0

void __thiscall
Eigen::
CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,2>,0,Eigen::Stride<0,0>>const,256>
::
CoeffBasedProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,2>,0,Eigen::Stride<0,0>>>
          (CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>
           *this,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>
                 *lhs,Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> *rhs)

{
  Index IVar1;
  Index IVar2;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>_>
  *in_RDX;
  Matrix<double,__1,_1,_0,_2,_1> *in_RSI;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> *in_stack_ffffffffffffffc8;
  
  MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>_>
  ::MatrixBase((MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>_>
                *)0x3003b2);
  Matrix<double,-1,1,0,2,1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const>>
            (in_RSI,in_RDX);
  Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_RDI,in_stack_ffffffffffffffc8);
  Matrix<double,_-1,_-1,_0,_2,_2>::Matrix((Matrix<double,__1,__1,_0,_2,_2> *)0x3003e2);
  IVar1 = CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>
          ::cols((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>
                  *)0x3003ec);
  IVar2 = MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x3003fb);
  if (IVar1 != IVar2) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                  ,0x9e,
                  "Eigen::CoeffBasedProduct<Eigen::Matrix<double, -1, 1, 0, 2, 1>, const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 2>>, 256>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, 1, 0, 2, 1>, Rhs = const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 2>>, NestingFlags = 256, Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>>, Rhs = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 2>>]"
                 );
  }
  return;
}

Assistant:

inline CoeffBasedProduct(const Lhs& lhs, const Rhs& rhs)
      : m_lhs(lhs), m_rhs(rhs)
    {
      // we don't allow taking products of matrices of different real types, as that wouldn't be vectorizable.
      // We still allow to mix T and complex<T>.
      EIGEN_STATIC_ASSERT((internal::scalar_product_traits<typename Lhs::RealScalar, typename Rhs::RealScalar>::Defined),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
      eigen_assert(lhs.cols() == rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }